

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int ncnn::get_cpu_support_x86_xop(void)

{
  uint cpu_info [4];
  uint in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  uint local_10;
  int in_stack_fffffffffffffff4;
  uint local_4;
  
  memset(&stack0xffffffffffffffe8,0,0x10);
  x86_cpuid(in_stack_fffffffffffffff4,
            (uint *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (in_stack_ffffffffffffffe8 < 0x80000001) {
    local_4 = 0;
  }
  else {
    x86_cpuid(in_stack_fffffffffffffff4,
              (uint *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    local_4 = local_10 & 0x800;
  }
  return local_4;
}

Assistant:

static int get_cpu_support_x86_xop()
{
#if !NCNN_XOP
    return 0;
#endif
    unsigned int cpu_info[4] = {0};
    x86_cpuid(0x80000000, cpu_info);

    if (cpu_info[0] < 0x80000001)
        return 0;

    x86_cpuid(0x80000001, cpu_info);

    return cpu_info[2] & (1u << 11);
}